

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void build_live_ranges(gen_ctx_t gen_ctx)

{
  MIR_insn_t start_insn;
  MIR_reg_t MVar1;
  size_t sVar2;
  bb_t_conflict pbVar3;
  bb_t_conflict bb_00;
  bb_t_conflict pbVar4;
  bb_t_conflict *__base;
  bb_insn_t_conflict pbVar5;
  bb_t_conflict local_40;
  bb_t_conflict bb;
  MIR_insn_t head_insn;
  MIR_insn_t next_insn;
  MIR_insn_t insn;
  ulong uStack_18;
  MIR_reg_t max_var;
  size_t i;
  gen_ctx_t gen_ctx_local;
  
  gen_ctx->lr_ctx->curr_point = 0;
  MVar1 = get_max_var(gen_ctx);
  sVar2 = VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges);
  if (sVar2 == 0) {
    for (uStack_18 = 0; uStack_18 <= MVar1; uStack_18 = uStack_18 + 1) {
      VARR_live_range_tpush(gen_ctx->lr_ctx->var_live_ranges,(live_range_t_conflict)0x0);
    }
    if (gen_ctx->optimize_level == 0) {
      bb = (bb_t_conflict)DLIST_MIR_insn_t_head(&((gen_ctx->curr_func_item->u).func)->insns);
      pbVar3 = bb;
      while (next_insn = (MIR_insn_t)pbVar3, next_insn != (MIR_insn_t)0x0) {
        pbVar3 = (bb_t_conflict)DLIST_MIR_insn_t_next(next_insn);
        bb_00 = get_insn_bb(gen_ctx,(MIR_insn_t)bb);
        if ((pbVar3 == (bb_t_conflict)0x0) ||
           (pbVar4 = get_insn_bb(gen_ctx,(MIR_insn_t)pbVar3), bb_00 != pbVar4)) {
          process_bb_ranges(gen_ctx,bb_00,(MIR_insn_t)bb,next_insn);
          bb = pbVar3;
        }
      }
    }
    else {
      VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,0);
      for (local_40 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); local_40 != (bb_t_conflict)0x0;
          local_40 = DLIST_bb_t_next(local_40)) {
        VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,local_40);
      }
      if (gen_ctx->optimize_level < 2) {
        __base = VARR_bb_taddr(gen_ctx->data_flow_ctx->worklist);
        sVar2 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
        qsort(__base,sVar2,8,post_cmp);
      }
      for (uStack_18 = 0; sVar2 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist),
          uStack_18 < sVar2; uStack_18 = uStack_18 + 1) {
        pbVar3 = VARR_bb_tget(gen_ctx->data_flow_ctx->worklist,uStack_18);
        pbVar5 = DLIST_bb_insn_t_head(&pbVar3->bb_insns);
        if (pbVar5 != (bb_insn_t_conflict)0x0) {
          pbVar5 = DLIST_bb_insn_t_head(&pbVar3->bb_insns);
          start_insn = pbVar5->insn;
          pbVar5 = DLIST_bb_insn_t_tail(&pbVar3->bb_insns);
          process_bb_ranges(gen_ctx,pbVar3,start_insn,pbVar5->insn);
        }
      }
    }
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      print_all_live_ranges(gen_ctx);
    }
    shrink_live_ranges(gen_ctx);
    return;
  }
  __assert_fail("(VARR_live_range_tlength (gen_ctx->lr_ctx->var_live_ranges)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1980,"void build_live_ranges(gen_ctx_t)");
}

Assistant:

static void build_live_ranges (gen_ctx_t gen_ctx) {
  size_t i;
  MIR_reg_t max_var;
  MIR_insn_t insn, next_insn, head_insn;
  bb_t bb;

  curr_point = 0;
  max_var = get_max_var (gen_ctx);
  gen_assert (VARR_LENGTH (live_range_t, var_live_ranges) == 0);
  for (i = 0; i <= max_var; i++) VARR_PUSH (live_range_t, var_live_ranges, NULL);
  if (optimize_level == 0) {
    for (head_insn = insn = DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns); insn != NULL;
         insn = next_insn) {
      next_insn = DLIST_NEXT (MIR_insn_t, insn);
      bb = get_insn_bb (gen_ctx, head_insn);
      if (next_insn == NULL || bb != get_insn_bb (gen_ctx, next_insn)) {
        process_bb_ranges (gen_ctx, bb, head_insn, insn);
        head_insn = next_insn;
      }
    }
  } else {
    VARR_TRUNC (bb_t, worklist, 0);
    for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
      VARR_PUSH (bb_t, worklist, bb);
    if (optimize_level <= 1) /* arrange BBs in PO (post order) for more compact ranges: */
      qsort (VARR_ADDR (bb_t, worklist), VARR_LENGTH (bb_t, worklist), sizeof (bb), post_cmp);
    for (i = 0; i < VARR_LENGTH (bb_t, worklist); i++) {
      bb = VARR_GET (bb_t, worklist, i);
      if (DLIST_HEAD (bb_insn_t, bb->bb_insns) == NULL) continue;
      process_bb_ranges (gen_ctx, bb, DLIST_HEAD (bb_insn_t, bb->bb_insns)->insn,
                         DLIST_TAIL (bb_insn_t, bb->bb_insns)->insn);
    }
  }
  DEBUG (2, { print_all_live_ranges (gen_ctx); });
  shrink_live_ranges (gen_ctx);
}